

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O3

double Metric(ANNpoint x1,ANNpoint x2,int dim,int *topology,ANNpoint scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double __x;
  
  dVar11 = 0.0;
  if (0 < dim) {
    iVar8 = 0;
    do {
      iVar7 = topology[iVar8];
      if (iVar7 == 3) {
        dVar9 = x1[iVar8];
        dVar10 = x2[iVar8];
        dVar1 = x1[(long)iVar8 + 1];
        dVar2 = x1[(long)iVar8 + 2];
        dVar3 = x2[(long)iVar8 + 1];
        dVar4 = x2[(long)iVar8 + 2];
        dVar5 = x1[(long)iVar8 + 3];
        dVar6 = x2[(long)iVar8 + 3];
        __x = dVar5 * dVar6 + dVar2 * dVar4 + dVar9 * dVar10 + dVar1 * dVar3;
        if (1.0 < __x) {
          dVar9 = (dVar6 * dVar6 + dVar4 * dVar4 + dVar10 * dVar10 + dVar3 * dVar3) *
                  (dVar5 * dVar5 + dVar2 * dVar2 + dVar9 * dVar9 + dVar1 * dVar1);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          __x = __x / dVar9;
        }
        dVar9 = acos(__x);
        dVar10 = acos(-__x);
        dVar9 = acos((double)(~-(ulong)(dVar10 < dVar9) & (ulong)__x |
                             (ulong)-__x & -(ulong)(dVar10 < dVar9)));
        dVar9 = dVar9 * scale[iVar8] * dVar9 * scale[iVar8];
        iVar8 = iVar8 + 3;
LAB_001048d5:
        dVar11 = dVar11 + dVar9;
      }
      else if (iVar7 == 2) {
        dVar10 = ABS(x1[iVar8] - x2[iVar8]);
        dVar9 = 6.283185307179586 - dVar10;
        if (dVar10 <= 6.283185307179586 - dVar10) {
          dVar9 = dVar10;
        }
        dVar11 = dVar11 + dVar9 * scale[iVar8] * dVar9 * scale[iVar8];
      }
      else if (iVar7 == 1) {
        dVar9 = (x1[iVar8] - x2[iVar8]) * scale[iVar8];
        dVar9 = dVar9 * dVar9;
        goto LAB_001048d5;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < dim);
  }
  if (0.0 <= dVar11) {
    return SQRT(dVar11);
  }
  dVar11 = sqrt(dVar11);
  return dVar11;
}

Assistant:

double Metric(const ANNpoint x1, const ANNpoint x2, int dim, int *topology,
              ANNpoint scale) {
    double rho = 0, fd, dtheta;

    for (int i = 0; i < dim; i++) {
        if (topology[i] == 1) {
            rho += ANN_POW(scale[i] * (x1[i] - x2[i]));
        } else if (topology[i] == 2) {
            fd = fabs(x1[i] - x2[i]);
            dtheta = ANN_MIN(fd, 2.0 * PI - fd);
            rho += ANN_POW(scale[i] * dtheta);
        } else if (topology[i] == 3) {
            // dot product
            fd = x1[i] * x2[i] + x1[i + 1] * x2[i + 1] + x1[i + 2] * x2[i + 2] +
                 x1[i + 3] * x2[i + 3];
            // Handle non-unit quaternions only if they're larger than 1 (why?)
            // should this be >0 to avoid divide by zero?
            if (fd > 1) {
                double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                               x1[i + 2] * x1[i + 2] + x1[i + 3] * x1[i + 3];
                double norm2 = x2[i] * x2[i] + x2[i + 1] * x2[i + 1] +
                               x2[i + 2] * x2[i + 2] + x2[i + 3] * x2[i + 3];
                fd = fd / (sqrt(norm1 * norm2));
            }
            dtheta = ANN_MIN(acos(fd), acos(-fd)); // Quaterion angle in radians
            rho += ANN_POW(scale[i] * dtheta); // squared scaled angle in radians
            i = i + 3;
        }
    }
    // cout << "dist = " << sqrt(rho) << endl <<endl;

    return sqrt(rho);
}